

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TryCatchStatement.h
# Opt level: O0

void __thiscall
TryCatchStatement::TryCatchStatement
          (TryCatchStatement *this,Identifier *ident,ptr<StatementBlock> *tryBlock,
          ptr<StatementBlock> *catchBlock)

{
  ptr<StatementBlock> *catchBlock_local;
  ptr<StatementBlock> *tryBlock_local;
  Identifier *ident_local;
  TryCatchStatement *this_local;
  
  Statement::Statement(&this->super_Statement);
  (this->super_Statement)._vptr_Statement = (_func_int **)&PTR_execute_00193da8;
  std::__cxx11::string::string((string *)&this->ident,(string *)ident);
  std::shared_ptr<StatementBlock>::shared_ptr(&this->tryBlock,tryBlock);
  std::shared_ptr<StatementBlock>::shared_ptr(&this->catchBlock,catchBlock);
  return;
}

Assistant:

TryCatchStatement(Identifier ident, ptr<StatementBlock> tryBlock, ptr<StatementBlock> catchBlock)
            : ident(ident), tryBlock(tryBlock), catchBlock(catchBlock) { }